

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_radix_tree.hpp
# Opt level: O0

int __thiscall
cinatra::radix_tree::insert
          (radix_tree *this,string *path,
          function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *handler,
          string *method)

{
  char cVar1;
  initializer_list<std::shared_ptr<cinatra::radix_tree_node>_> __l;
  bool bVar2;
  __type_conflict4 _Var3;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  element_type *peVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  shared_ptr<cinatra::radix_tree_node> child_1;
  size_type m;
  unsigned_long j;
  int p;
  shared_ptr<cinatra::radix_tree_node> child;
  int code;
  int param_count;
  int n;
  int i;
  shared_ptr<cinatra::radix_tree_node> root;
  undefined7 in_stack_fffffffffffffbf8;
  char in_stack_fffffffffffffbff;
  int in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  int iVar8;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  element_type *in_stack_fffffffffffffc10;
  radix_tree_node *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  undefined8 **local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  radix_tree_node *in_stack_fffffffffffffc70;
  radix_tree_node *in_stack_fffffffffffffc78;
  element_type *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  byte local_2e3;
  byte local_2e2;
  byte local_2e1;
  undefined8 *local_2b0 [2];
  undefined1 **local_2a0;
  undefined8 local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [4];
  ulong local_200;
  ulong local_1f8;
  int local_12c;
  int local_84;
  __shared_ptr local_80 [19];
  byte local_6d;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<cinatra::radix_tree_node>::shared_ptr
            ((shared_ptr<cinatra::radix_tree_node> *)
             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             (shared_ptr<cinatra::radix_tree_node> *)
             CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
  local_34 = 0;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (local_10);
  local_38 = (int)sVar4;
  local_3c = 0;
  local_40 = 0;
  do {
    if (local_38 <= local_34) break;
    std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x33f822);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33f831
                      );
    local_6d = 0;
    local_2e1 = 0;
    if (!bVar2) {
      std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x33f85a);
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                          CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      local_2e2 = 1;
      if (*pvVar5 != '*') {
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                            CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        local_2e2 = 1;
        if (*pvVar6 != '*') {
          pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                              CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          if (*pvVar6 != ':') {
            std::
            __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x33f8d6);
            pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                  CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            local_2e2 = 1;
            if (*pvVar5 == ':') goto LAB_0033fa6c;
          }
          pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                              CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          if (*pvVar6 == ':') {
            std::
            __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x33f928);
            pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                  CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            local_2e2 = 1;
            if (*pvVar5 != ':') goto LAB_0033fa6c;
          }
          pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                              CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          local_2e3 = 0;
          if (*pvVar6 == ':') {
            std::
            __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x33f987);
            pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                  CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            local_2e3 = 0;
            if (*pvVar5 == ':') {
              find_pos((radix_tree *)in_stack_fffffffffffffc10,
                       (string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                       (char)((uint)in_stack_fffffffffffffc04 >> 0x18),in_stack_fffffffffffffc00);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&in_stack_fffffffffffffc18->path,(size_type)in_stack_fffffffffffffc10,
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
              local_6d = 1;
              peVar7 = std::
                       __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x33fa2a);
              std::
              vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
              ::operator[](&peVar7->children,0);
              std::
              __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x33fa45);
              _Var3 = std::operator==(in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->path);
              local_2e3 = _Var3 ^ 0xff;
            }
          }
          local_2e2 = local_2e3;
        }
      }
LAB_0033fa6c:
      local_2e1 = local_2e2;
    }
    if ((local_6d & 1) != 0) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    }
    if ((local_2e1 & 1) != 0) {
      local_40 = -1;
      break;
    }
    std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x33fae4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
    radix_tree_node::get_child
              (in_stack_fffffffffffffc18,(char)((ulong)in_stack_fffffffffffffc10 >> 0x38));
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_80);
    if (bVar2) {
      std::shared_ptr<cinatra::radix_tree_node>::operator=
                ((shared_ptr<cinatra::radix_tree_node> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (shared_ptr<cinatra::radix_tree_node> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                          CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      if (*pvVar6 == ':') {
        local_3c = local_3c + 1;
        peVar7 = std::
                 __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x340224);
        sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(&peVar7->path);
        local_34 = local_34 + (int)sVar4 + 1;
        if (local_34 == local_38) {
          in_stack_fffffffffffffc98 =
               std::
               __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x340266);
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   in_stack_fffffffffffffc10,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          local_40 = radix_tree_node::add_handler
                               (in_stack_fffffffffffffc70,
                                (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                 *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                in_stack_fffffffffffffc60);
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          ~function((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                    0x3402c6);
          local_12c = 3;
        }
        else {
LAB_003407e5:
          local_12c = 0;
        }
      }
      else {
        local_1f8 = 0;
        peVar7 = std::
                 __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x34031a);
        local_200 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(&peVar7->path);
        while( true ) {
          bVar2 = false;
          if ((local_34 < local_38) && (bVar2 = false, local_1f8 < local_200)) {
            pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                  CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            cVar1 = *pvVar6;
            std::
            __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x34038a);
            pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                                  CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            bVar2 = cVar1 == *pvVar5;
          }
          if (!bVar2) break;
          local_34 = local_34 + 1;
          local_1f8 = local_1f8 + 1;
        }
        if (local_1f8 < local_200) {
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x34040f);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&in_stack_fffffffffffffc18->path,(size_type)in_stack_fffffffffffffc10,
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>(in_stack_fffffffffffffc28)
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x340461);
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x34047a);
          handler_t::operator=
                    ((handler_t *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     (handler_t *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          peVar7 = std::
                   __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x34049d);
          in_stack_fffffffffffffc78 = (radix_tree_node *)&peVar7->indices;
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3404b8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          peVar7 = std::
                   __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x3404de);
          in_stack_fffffffffffffc70 = (radix_tree_node *)&peVar7->children;
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3404f6);
          std::
          vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
          ::operator=((vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                       *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                       *)in_stack_fffffffffffffc98);
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x340519);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&in_stack_fffffffffffffc18->path,(size_type)in_stack_fffffffffffffc10,
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          in_stack_fffffffffffffc60 = &local_30;
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x340549);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
          in_stack_fffffffffffffc58 = local_290;
          std::__cxx11::string::string(&in_stack_fffffffffffffc10->path);
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x340591);
          handler_t::operator=
                    ((handler_t *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     (handler_t *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          handler_t::~handler_t
                    ((handler_t *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3405b9);
          pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                              CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          in_stack_fffffffffffffc6c = (int)*pvVar5;
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3405d6);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     in_stack_fffffffffffffbff);
          std::shared_ptr<cinatra::radix_tree_node>::shared_ptr
                    ((shared_ptr<cinatra::radix_tree_node> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     (shared_ptr<cinatra::radix_tree_node> *)
                     CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          local_298 = 1;
          local_2a0 = (undefined1 **)local_2b0;
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x34062b);
          __l._M_len = (size_type)in_stack_fffffffffffffc20;
          __l._M_array = (iterator)in_stack_fffffffffffffc18;
          std::
          vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
          ::operator=((vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                       *)in_stack_fffffffffffffc10,__l);
          local_3c0 = &local_2a0;
          do {
            local_3c0 = local_3c0 + -2;
            std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                      ((shared_ptr<cinatra::radix_tree_node> *)0x340675);
          } while (local_3c0 != local_2b0);
          std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                    ((shared_ptr<cinatra::radix_tree_node> *)0x340696);
        }
        if (local_34 != local_38) goto LAB_003407e5;
        in_stack_fffffffffffffc10 =
             std::
             __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x34075d);
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
                  ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   in_stack_fffffffffffffc10,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        in_stack_fffffffffffffc0c =
             radix_tree_node::add_handler
                       (in_stack_fffffffffffffc70,
                        (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                         *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                        in_stack_fffffffffffffc60);
        local_40 = in_stack_fffffffffffffc0c;
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::~function
                  ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   0x3407b1);
        local_12c = 3;
      }
    }
    else {
      local_84 = find_pos((radix_tree *)in_stack_fffffffffffffc10,
                          (string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                          (char)((uint)in_stack_fffffffffffffc04 >> 0x18),in_stack_fffffffffffffc00)
      ;
      if (local_84 == local_38) {
        local_84 = find_pos((radix_tree *)in_stack_fffffffffffffc10,
                            (string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                            (char)((uint)in_stack_fffffffffffffc04 >> 0x18),
                            in_stack_fffffffffffffc00);
        std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x33fba1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&in_stack_fffffffffffffc18->path,(size_type)in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>(in_stack_fffffffffffffc28);
        radix_tree_node::insert_child
                  (in_stack_fffffffffffffc78,(char)((ulong)in_stack_fffffffffffffc70 >> 0x38),
                   (shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        std::shared_ptr<cinatra::radix_tree_node>::operator=
                  ((shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   (shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                  ((shared_ptr<cinatra::radix_tree_node> *)0x33fc56);
        std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                  ((shared_ptr<cinatra::radix_tree_node> *)0x33fc63);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
        if (local_84 < local_38) {
          std::
          __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x33fc91);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&in_stack_fffffffffffffc18->path,(size_type)in_stack_fffffffffffffc10,
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>(in_stack_fffffffffffffc28)
          ;
          radix_tree_node::insert_child
                    (in_stack_fffffffffffffc78,(char)((ulong)in_stack_fffffffffffffc70 >> 0x38),
                     (shared_ptr<cinatra::radix_tree_node> *)
                     CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          std::shared_ptr<cinatra::radix_tree_node>::operator=
                    ((shared_ptr<cinatra::radix_tree_node> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     (shared_ptr<cinatra::radix_tree_node> *)
                     CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                    ((shared_ptr<cinatra::radix_tree_node> *)0x33fd20);
          std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                    ((shared_ptr<cinatra::radix_tree_node> *)0x33fd2d);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
          local_3c = local_3c + 1;
        }
        std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x33fe08);
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
                  ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   in_stack_fffffffffffffc10,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        local_40 = radix_tree_node::add_handler
                             (in_stack_fffffffffffffc70,
                              (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                               *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                              in_stack_fffffffffffffc60);
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::~function
                  ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   0x33fe68);
        local_12c = 3;
      }
      else {
        std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x33feab);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&in_stack_fffffffffffffc18->path,(size_type)in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>(in_stack_fffffffffffffc28);
        radix_tree_node::insert_child
                  (in_stack_fffffffffffffc78,(char)((ulong)in_stack_fffffffffffffc70 >> 0x38),
                   (shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        std::shared_ptr<cinatra::radix_tree_node>::operator=
                  ((shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   (shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                  ((shared_ptr<cinatra::radix_tree_node> *)0x33ff70);
        std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                  ((shared_ptr<cinatra::radix_tree_node> *)0x33ff7d);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
        local_34 = find_pos((radix_tree *)in_stack_fffffffffffffc10,
                            (string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                            (char)((uint)in_stack_fffffffffffffc04 >> 0x18),
                            in_stack_fffffffffffffc00);
        std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x33ffbf);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&in_stack_fffffffffffffc18->path,(size_type)in_stack_fffffffffffffc10,
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>(in_stack_fffffffffffffc28);
        radix_tree_node::insert_child
                  (in_stack_fffffffffffffc78,(char)((ulong)in_stack_fffffffffffffc70 >> 0x38),
                   (shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        std::shared_ptr<cinatra::radix_tree_node>::operator=
                  ((shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   (shared_ptr<cinatra::radix_tree_node> *)
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                  ((shared_ptr<cinatra::radix_tree_node> *)0x340057);
        std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
                  ((shared_ptr<cinatra::radix_tree_node> *)0x340064);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
        local_3c = local_3c + 1;
        if (local_34 != local_38) goto LAB_003407e5;
        std::__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3400a3);
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
                  ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   in_stack_fffffffffffffc10,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        in_stack_fffffffffffffca4 =
             radix_tree_node::add_handler
                       (in_stack_fffffffffffffc70,
                        (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                         *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                        in_stack_fffffffffffffc60);
        local_40 = in_stack_fffffffffffffca4;
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::~function
                  ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   0x340103);
        local_12c = 3;
      }
    }
    std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
              ((shared_ptr<cinatra::radix_tree_node> *)0x3407fd);
  } while (local_12c == 0);
  iVar8 = local_3c;
  peVar7 = std::
           __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x340838);
  if (peVar7->max_params < iVar8) {
    iVar8 = local_3c;
    peVar7 = std::
             __shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x34085f);
    peVar7->max_params = iVar8;
  }
  local_12c = 1;
  std::shared_ptr<cinatra::radix_tree_node>::~shared_ptr
            ((shared_ptr<cinatra::radix_tree_node> *)0x34088c);
  return local_40;
}

Assistant:

int insert(
      const std::string &path,
      std::function<void(coro_http_request &req, coro_http_response &resp)>
          handler,
      const std::string &method) {
    auto root = this->root;
    int i = 0, n = path.size(), param_count = 0, code = 0;
    while (i < n) {
      if (!root->indices.empty() &&
          (root->indices[0] == type_asterisk || path[i] == type_asterisk ||
           (path[i] != type_colon && root->indices[0] == type_colon) ||
           (path[i] == type_colon && root->indices[0] != type_colon) ||
           (path[i] == type_colon && root->indices[0] == type_colon &&
            path.substr(i + 1, find_pos(path, type_slash, i) - i - 1) !=
                root->children[0]->path))) {
        code = -1;
        break;
      }

      auto child = root->get_child(path[i]);
      if (!child) {
        auto p = find_pos(path, type_colon, i);

        if (p == n) {
          p = find_pos(path, type_asterisk, i);

          root = root->insert_child(path[i], std::make_shared<radix_tree_node>(
                                                 path.substr(i, p - i)));

          if (p < n) {
            root = root->insert_child(
                type_asterisk,
                std::make_shared<radix_tree_node>(path.substr(p + 1)));
            ++param_count;
          }

          code = root->add_handler(handler, method);
          break;
        }

        root = root->insert_child(
            path[i], std::make_shared<radix_tree_node>(path.substr(i, p - i)));

        i = find_pos(path, type_slash, p);

        root = root->insert_child(
            type_colon,
            std::make_shared<radix_tree_node>(path.substr(p + 1, i - p - 1)));
        ++param_count;

        if (i == n) {
          code = root->add_handler(handler, method);
          break;
        }
      }
      else {
        root = child;

        if (path[i] == type_colon) {
          ++param_count;
          i += root->path.size() + 1;

          if (i == n) {
            code = root->add_handler(handler, method);
            break;
          }
        }
        else {
          auto j = 0UL;
          auto m = root->path.size();

          for (; i < n && j < m && path[i] == root->path[j]; ++i, ++j) {
          }

          if (j < m) {
            std::shared_ptr<radix_tree_node> child(
                std::make_shared<radix_tree_node>(root->path.substr(j)));
            child->handler = root->handler;
            child->indices = root->indices;
            child->children = root->children;

            root->path = root->path.substr(0, j);
            root->handler = {};
            root->indices = child->path[0];
            root->children = {child};
          }

          if (i == n) {
            code = root->add_handler(handler, method);
            break;
          }
        }
      }
    }

    if (param_count > this->root->max_params)
      this->root->max_params = param_count;

    return code;
  }